

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlDrawRenderBatch(RenderBatch *batch)

{
  Matrix *pMVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  GLenum GVar18;
  DrawCall *pDVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  _Bool _Var36;
  int iVar37;
  int iVar38;
  int i;
  long lVar39;
  long lVar40;
  int iVar41;
  float16 buffer;
  Matrix matProjection;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  long local_80;
  Matrix local_78;
  
  if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
    }
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 3,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 2,
               batch->vertexBuffer[batch->currentBuffer].colors);
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
  }
  _Var36 = RLGL.State.stereoRender;
  fVar35 = RLGL.State.modelview.m15;
  fVar34 = RLGL.State.modelview.m11;
  fVar33 = RLGL.State.modelview.m7;
  fVar32 = RLGL.State.modelview.m3;
  fVar31 = RLGL.State.modelview.m14;
  fVar30 = RLGL.State.modelview.m10;
  fVar29 = RLGL.State.modelview.m6;
  fVar28 = RLGL.State.modelview.m2;
  fVar27 = RLGL.State.modelview.m13;
  fVar26 = RLGL.State.modelview.m9;
  fVar25 = RLGL.State.modelview.m5;
  fVar24 = RLGL.State.modelview.m1;
  fVar23 = RLGL.State.modelview.m12;
  fVar22 = RLGL.State.modelview.m8;
  fVar21 = RLGL.State.modelview.m4;
  fVar20 = RLGL.State.modelview.m0;
  local_78.m3 = RLGL.State.projection.m3;
  local_78.m7 = RLGL.State.projection.m7;
  local_78.m11 = RLGL.State.projection.m11;
  local_78.m15 = RLGL.State.projection.m15;
  local_78.m2 = RLGL.State.projection.m2;
  local_78.m6 = RLGL.State.projection.m6;
  local_78.m10 = RLGL.State.projection.m10;
  local_78.m14 = RLGL.State.projection.m14;
  local_78.m1 = RLGL.State.projection.m1;
  local_78.m5 = RLGL.State.projection.m5;
  local_78.m9 = RLGL.State.projection.m9;
  local_78.m13 = RLGL.State.projection.m13;
  local_78.m0 = RLGL.State.projection.m0;
  local_78.m4 = RLGL.State.projection.m4;
  local_78.m8 = RLGL.State.projection.m8;
  local_78.m12 = RLGL.State.projection.m12;
  lVar39 = 0;
  do {
    if (_Var36 != false) {
      (*glad_glViewport)(((int)lVar39 * RLGL.State.framebufferWidth) / 2,0,
                         RLGL.State.framebufferWidth / 2,RLGL.State.framebufferHeight);
      fVar2 = RLGL.State.viewOffsetStereo[lVar39].m0;
      fVar3 = RLGL.State.viewOffsetStereo[lVar39].m4;
      fVar4 = RLGL.State.viewOffsetStereo[lVar39].m8;
      fVar5 = RLGL.State.viewOffsetStereo[lVar39].m12;
      fVar6 = RLGL.State.viewOffsetStereo[lVar39].m1;
      fVar7 = RLGL.State.viewOffsetStereo[lVar39].m5;
      fVar8 = RLGL.State.viewOffsetStereo[lVar39].m9;
      fVar9 = RLGL.State.viewOffsetStereo[lVar39].m13;
      fVar10 = RLGL.State.viewOffsetStereo[lVar39].m2;
      fVar11 = RLGL.State.viewOffsetStereo[lVar39].m6;
      fVar12 = RLGL.State.viewOffsetStereo[lVar39].m10;
      fVar13 = RLGL.State.viewOffsetStereo[lVar39].m14;
      RLGL.State.modelview.m0 = fVar32 * fVar5 + fVar28 * fVar4 + fVar20 * fVar2 + fVar24 * fVar3;
      RLGL.State.modelview.m1 = fVar32 * fVar9 + fVar28 * fVar8 + fVar20 * fVar6 + fVar24 * fVar7;
      RLGL.State.modelview.m2 =
           fVar32 * fVar13 + fVar28 * fVar12 + fVar20 * fVar10 + fVar24 * fVar11;
      fVar14 = RLGL.State.viewOffsetStereo[lVar39].m7;
      fVar15 = RLGL.State.viewOffsetStereo[lVar39].m3;
      fVar16 = RLGL.State.viewOffsetStereo[lVar39].m11;
      fVar17 = RLGL.State.viewOffsetStereo[lVar39].m15;
      RLGL.State.modelview.m3 =
           fVar32 * fVar17 + fVar28 * fVar16 + fVar20 * fVar15 + fVar24 * fVar14;
      RLGL.State.modelview.m4 = fVar33 * fVar5 + fVar29 * fVar4 + fVar21 * fVar2 + fVar25 * fVar3;
      RLGL.State.modelview.m5 = fVar33 * fVar9 + fVar29 * fVar8 + fVar21 * fVar6 + fVar25 * fVar7;
      RLGL.State.modelview.m6 =
           fVar33 * fVar13 + fVar29 * fVar12 + fVar21 * fVar10 + fVar25 * fVar11;
      RLGL.State.modelview.m7 =
           fVar33 * fVar17 + fVar29 * fVar16 + fVar21 * fVar15 + fVar25 * fVar14;
      RLGL.State.modelview.m8 = fVar34 * fVar5 + fVar30 * fVar4 + fVar22 * fVar2 + fVar26 * fVar3;
      RLGL.State.modelview.m9 = fVar34 * fVar9 + fVar30 * fVar8 + fVar22 * fVar6 + fVar26 * fVar7;
      RLGL.State.modelview.m10 =
           fVar34 * fVar13 + fVar30 * fVar12 + fVar22 * fVar10 + fVar26 * fVar11;
      RLGL.State.modelview.m11 =
           fVar34 * fVar17 + fVar30 * fVar16 + fVar22 * fVar15 + fVar26 * fVar14;
      RLGL.State.modelview.m12 = fVar5 * fVar35 + fVar4 * fVar31 + fVar2 * fVar23 + fVar3 * fVar27;
      RLGL.State.modelview.m13 = fVar9 * fVar35 + fVar8 * fVar31 + fVar6 * fVar23 + fVar7 * fVar27;
      RLGL.State.modelview.m14 =
           fVar13 * fVar35 + fVar12 * fVar31 + fVar10 * fVar23 + fVar11 * fVar27;
      RLGL.State.modelview.m15 =
           fVar17 * fVar35 + fVar16 * fVar31 + fVar15 * fVar23 + fVar14 * fVar27;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m0 = pMVar1->m0;
      RLGL.State.projection.m4 = pMVar1->m4;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m8 = pMVar1->m8;
      RLGL.State.projection.m12 = pMVar1->m12;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m1 = pMVar1->m1;
      RLGL.State.projection.m5 = pMVar1->m5;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m9 = pMVar1->m9;
      RLGL.State.projection.m13 = pMVar1->m13;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m2 = pMVar1->m2;
      RLGL.State.projection.m6 = pMVar1->m6;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m10 = pMVar1->m10;
      RLGL.State.projection.m14 = pMVar1->m14;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m3 = pMVar1->m3;
      RLGL.State.projection.m7 = pMVar1->m7;
      pMVar1 = RLGL.State.projectionStereo + lVar39;
      RLGL.State.projection.m11 = pMVar1->m11;
      RLGL.State.projection.m15 = pMVar1->m15;
    }
    lVar40 = lVar39;
    if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShader.id);
      _local_c8 = CONCAT44(RLGL.State.modelview.m3 * RLGL.State.projection.m13 +
                           RLGL.State.modelview.m2 * RLGL.State.projection.m9 +
                           RLGL.State.modelview.m0 * RLGL.State.projection.m1 +
                           RLGL.State.projection.m5 * RLGL.State.modelview.m1,
                           RLGL.State.modelview.m3 * RLGL.State.projection.m12 +
                           RLGL.State.modelview.m2 * RLGL.State.projection.m8 +
                           RLGL.State.modelview.m0 * RLGL.State.projection.m0 +
                           RLGL.State.projection.m4 * RLGL.State.modelview.m1);
      _fStack_c0 = CONCAT44(RLGL.State.modelview.m3 * RLGL.State.projection.m15 +
                            RLGL.State.modelview.m2 * RLGL.State.projection.m11 +
                            RLGL.State.modelview.m0 * RLGL.State.projection.m3 +
                            RLGL.State.modelview.m1 * RLGL.State.projection.m7,
                            RLGL.State.modelview.m3 * RLGL.State.projection.m14 +
                            RLGL.State.modelview.m2 * RLGL.State.projection.m10 +
                            RLGL.State.modelview.m0 * RLGL.State.projection.m2 +
                            RLGL.State.projection.m6 * RLGL.State.modelview.m1);
      _local_b8 = CONCAT44(RLGL.State.modelview.m7 * RLGL.State.projection.m13 +
                           RLGL.State.modelview.m6 * RLGL.State.projection.m9 +
                           RLGL.State.modelview.m4 * RLGL.State.projection.m1 +
                           RLGL.State.projection.m5 * RLGL.State.modelview.m5,
                           RLGL.State.modelview.m7 * RLGL.State.projection.m12 +
                           RLGL.State.modelview.m6 * RLGL.State.projection.m8 +
                           RLGL.State.modelview.m4 * RLGL.State.projection.m0 +
                           RLGL.State.projection.m4 * RLGL.State.modelview.m5);
      _fStack_b0 = CONCAT44(RLGL.State.modelview.m7 * RLGL.State.projection.m15 +
                            RLGL.State.modelview.m6 * RLGL.State.projection.m11 +
                            RLGL.State.modelview.m4 * RLGL.State.projection.m3 +
                            RLGL.State.modelview.m5 * RLGL.State.projection.m7,
                            RLGL.State.modelview.m7 * RLGL.State.projection.m14 +
                            RLGL.State.modelview.m6 * RLGL.State.projection.m10 +
                            RLGL.State.modelview.m4 * RLGL.State.projection.m2 +
                            RLGL.State.projection.m6 * RLGL.State.modelview.m5);
      _local_a8 = CONCAT44(RLGL.State.modelview.m11 * RLGL.State.projection.m13 +
                           RLGL.State.modelview.m10 * RLGL.State.projection.m9 +
                           RLGL.State.modelview.m8 * RLGL.State.projection.m1 +
                           RLGL.State.projection.m5 * RLGL.State.modelview.m9,
                           RLGL.State.modelview.m11 * RLGL.State.projection.m12 +
                           RLGL.State.modelview.m10 * RLGL.State.projection.m8 +
                           RLGL.State.modelview.m8 * RLGL.State.projection.m0 +
                           RLGL.State.projection.m4 * RLGL.State.modelview.m9);
      _fStack_a0 = CONCAT44(RLGL.State.modelview.m11 * RLGL.State.projection.m15 +
                            RLGL.State.modelview.m10 * RLGL.State.projection.m11 +
                            RLGL.State.modelview.m8 * RLGL.State.projection.m3 +
                            RLGL.State.modelview.m9 * RLGL.State.projection.m7,
                            RLGL.State.modelview.m11 * RLGL.State.projection.m14 +
                            RLGL.State.modelview.m10 * RLGL.State.projection.m10 +
                            RLGL.State.modelview.m8 * RLGL.State.projection.m2 +
                            RLGL.State.projection.m6 * RLGL.State.modelview.m9);
      _local_98 = CONCAT44(RLGL.State.projection.m13 * RLGL.State.modelview.m15 +
                           RLGL.State.projection.m9 * RLGL.State.modelview.m14 +
                           RLGL.State.projection.m1 * RLGL.State.modelview.m12 +
                           RLGL.State.projection.m5 * RLGL.State.modelview.m13,
                           RLGL.State.projection.m12 * RLGL.State.modelview.m15 +
                           RLGL.State.projection.m8 * RLGL.State.modelview.m14 +
                           RLGL.State.projection.m0 * RLGL.State.modelview.m12 +
                           RLGL.State.projection.m4 * RLGL.State.modelview.m13);
      _fStack_90 = CONCAT44(RLGL.State.modelview.m15 * RLGL.State.projection.m15 +
                            RLGL.State.modelview.m14 * RLGL.State.projection.m11 +
                            RLGL.State.modelview.m12 * RLGL.State.projection.m3 +
                            RLGL.State.projection.m7 * RLGL.State.modelview.m13,
                            RLGL.State.projection.m14 * RLGL.State.modelview.m15 +
                            RLGL.State.projection.m10 * RLGL.State.modelview.m14 +
                            RLGL.State.projection.m2 * RLGL.State.modelview.m12 +
                            RLGL.State.projection.m6 * RLGL.State.modelview.m13);
      (*glad_glUniformMatrix4fv)(RLGL.State.currentShader.locs[6],1,'\0',&local_c8);
      local_80 = lVar39;
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      else {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)
                  (RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
      }
      (*glad_glUniform4f)(RLGL.State.currentShader.locs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShader.locs[0xf],0);
      lVar39 = 0;
      do {
        if (RLGL.State.activeTextureId[lVar39] != 0) {
          (*glad_glActiveTexture)((int)lVar39 + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[lVar39]);
        }
        lVar39 = lVar39 + 1;
      } while (lVar39 != 4);
      (*glad_glActiveTexture)(0x84c0);
      if (0 < batch->drawsCounter) {
        lVar40 = 0;
        lVar39 = 0;
        iVar41 = 0;
        do {
          (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&batch->draws->textureId + lVar40));
          pDVar19 = batch->draws;
          GVar18 = *(GLenum *)((long)&pDVar19->mode + lVar40);
          if ((GVar18 == 4) || (GVar18 == 1)) {
            (*glad_glDrawArrays)(GVar18,iVar41,*(GLsizei *)((long)&pDVar19->vertexCount + lVar40));
          }
          else {
            iVar37 = *(int *)((long)&pDVar19->vertexCount + lVar40);
            iVar38 = iVar37 + 3;
            if (-1 < iVar37) {
              iVar38 = iVar37;
            }
            iVar37 = iVar41 + 3;
            if (-1 < iVar41) {
              iVar37 = iVar41;
            }
            (*glad_glDrawElements)
                      (4,(iVar38 >> 2) * 6,0x1405,(void *)((long)((iVar37 >> 2) * 6) << 2));
          }
          iVar41 = iVar41 + *(int *)((long)&batch->draws->vertexCount + lVar40) +
                   *(int *)((long)&batch->draws->vertexAlignment + lVar40);
          lVar39 = lVar39 + 1;
          lVar40 = lVar40 + 0x10;
        } while (lVar39 < batch->drawsCounter);
      }
      if (RLGL.ExtSupported.vao == false) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
      lVar40 = local_80;
    }
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
    (*glad_glUseProgram)(0);
  } while ((_Var36 != false) && (lVar39 = lVar40 + 1, lVar40 == 0));
  lVar39 = 0;
  batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].cCounter = 0;
  batch->currentDepth = -1.0;
  RLGL.State.projection.m3 = local_78.m3;
  RLGL.State.projection.m7 = local_78.m7;
  RLGL.State.projection.m11 = local_78.m11;
  RLGL.State.projection.m15 = local_78.m15;
  RLGL.State.projection.m2 = local_78.m2;
  RLGL.State.projection.m6 = local_78.m6;
  RLGL.State.projection.m10 = local_78.m10;
  RLGL.State.projection.m14 = local_78.m14;
  RLGL.State.projection.m1 = local_78.m1;
  RLGL.State.projection.m5 = local_78.m5;
  RLGL.State.projection.m9 = local_78.m9;
  RLGL.State.projection.m13 = local_78.m13;
  RLGL.State.projection.m0 = local_78.m0;
  RLGL.State.projection.m4 = local_78.m4;
  RLGL.State.projection.m8 = local_78.m8;
  RLGL.State.projection.m12 = local_78.m12;
  RLGL.State.modelview.m0 = fVar20;
  RLGL.State.modelview.m4 = fVar21;
  RLGL.State.modelview.m8 = fVar22;
  RLGL.State.modelview.m12 = fVar23;
  RLGL.State.modelview.m1 = fVar24;
  RLGL.State.modelview.m5 = fVar25;
  RLGL.State.modelview.m9 = fVar26;
  RLGL.State.modelview.m13 = fVar27;
  RLGL.State.modelview.m2 = fVar28;
  RLGL.State.modelview.m6 = fVar29;
  RLGL.State.modelview.m10 = fVar30;
  RLGL.State.modelview.m14 = fVar31;
  RLGL.State.modelview.m3 = fVar32;
  RLGL.State.modelview.m7 = fVar33;
  RLGL.State.modelview.m11 = fVar34;
  RLGL.State.modelview.m15 = fVar35;
  do {
    *(undefined4 *)((long)&batch->draws->mode + lVar39) = 7;
    *(undefined4 *)((long)&batch->draws->vertexCount + lVar39) = 0;
    *(uint *)((long)&batch->draws->textureId + lVar39) = RLGL.State.defaultTextureId;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x1000);
  RLGL.State.activeTextureId[0] = 0;
  RLGL.State.activeTextureId[1] = 0;
  RLGL.State.activeTextureId[2] = 0;
  RLGL.State.activeTextureId[3] = 0;
  batch->drawsCounter = 1;
  iVar37 = batch->currentBuffer + 1;
  iVar41 = 0;
  if (iVar37 < batch->buffersCount) {
    iVar41 = iVar37;
  }
  batch->currentBuffer = iVar41;
  return;
}

Assistant:

void rlDrawRenderBatch(RenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
    if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue.
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job.
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer().
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data.

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyesCount = 1;
    if (RLGL.State.stereoRender) eyesCount = 2;

    for (int eye = 0; eye < eyesCount; eye++)
    {
        if (eyesCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(MatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShader.id);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = MatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShader.locs[SHADER_LOC_MATRIX_MVP], 1, false, MatrixToFloat(matMVP));

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShader.locs[SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShader.locs[SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawsCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and binded to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
#if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: quadsCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
#endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counters for next frame
    batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].cCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawsCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->buffersCount) batch->currentBuffer = 0;
#endif
}